

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticSynapse.cpp
# Opt level: O2

void __thiscall
StaticSynapse::StaticSynapse
          (StaticSynapse *this,Population *n_from,Population *n_to,StaticSynapse_param *param)

{
  (this->super_Synapse)._vptr_Synapse = (_func_int **)&PTR_update_00111d58;
  this->param = param;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  initialize(this,n_from,n_to);
  return;
}

Assistant:

StaticSynapse::StaticSynapse(Population* n_from, Population* n_to, StaticSynapse_param* param) : 
    param(param)
{
    initialize(n_from, n_to);
}